

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void rmult(double *A,double *B,double *C,int m,int n,int p)

{
  int local_40;
  int i;
  int N;
  int strC;
  int strB;
  int strA;
  int p_local;
  int n_local;
  int m_local;
  double *C_local;
  double *B_local;
  double *A_local;
  
  for (local_40 = 0; local_40 < m * p; local_40 = local_40 + 1) {
    C[local_40] = 0.0;
  }
  recmult(A,B,C,m,n,p,m,n,p);
  return;
}

Assistant:

void rmult(double* A, double* B, double* C,int m,int n, int p) {
	int strA,strB,strC;
	int N;
	register int i;
	strA = m;
	strB = n;
	strC = p;
	N = m * p;
	for(i = 0; i < N; ++i) {
		C[i] = 0.;
	}
	
	recmult(A,B,C,m,n,p,strA,strB,strC);
	
}